

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void list_account_details(int account_number)

{
  long *plVar1;
  bool bVar2;
  char *pcVar3;
  Account account;
  ifstream inFile;
  byte abStack_210 [488];
  
  account._vptr_Account = (_func_int **)&PTR_create_account_00107c88;
  std::ifstream::ifstream(&inFile);
  std::ifstream::open((char *)&inFile,0x10513d);
  if ((abStack_210[*(long *)(_inFile + -0x18)] & 5) == 0) {
    std::operator<<((ostream *)&std::cout,"\nBALANCE DETAILS\n");
    bVar2 = true;
    while( true ) {
      plVar1 = (long *)std::istream::read((char *)&inFile,(long)&account);
      if ((*(byte *)((long)plVar1 + *(long *)(*plVar1 + -0x18) + 0x20) & 5) != 0) break;
      if (account.account_number == account_number) {
        bVar2 = false;
        Account::show_account(&account);
      }
    }
    std::ifstream::close();
    if (!bVar2) goto LAB_0010381c;
    pcVar3 = "\n\nAccount number does not exist";
  }
  else {
    pcVar3 = "File could not be open !! Press any Key...";
  }
  std::operator<<((ostream *)&std::cout,pcVar3);
LAB_0010381c:
  std::ifstream::~ifstream(&inFile);
  return;
}

Assistant:

void list_account_details(int account_number)
{
    /*!
     * It is a helper function that print details of account with th account_number
     */
    Account account;
    int flag=0;
    std::ifstream inFile;
    inFile.open("Account.dat",std::ios::binary);
    if(!inFile)
    {
        std::cout<<"File could not be open !! Press any Key...";
        return;
    }
    std::cout<<"\nBALANCE DETAILS\n";
    while(inFile.read((char *) &account, sizeof(Account)))
    {
        if(account.return_account_num()==account_number)
        {
            account.show_account();
            flag=1;
        }
    }
    inFile.close();
    if(flag==0)
        std::cout<<"\n\nAccount number does not exist";
}